

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrStructureTypeToString
                   (XrInstance instance,XrStructureType value,char *buffer)

{
  bool bVar1;
  ValidateXrHandleResult VVar2;
  GenValidUsageXrInstanceInfo *pGVar3;
  size_t sVar4;
  allocator local_5b1;
  string local_5b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_590;
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [32];
  string local_528 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_508;
  allocator local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [32];
  string local_4a0 [32];
  ostringstream local_480 [8];
  ostringstream oss_enum;
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  GenValidUsageXrInstanceInfo *local_290;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  string local_280 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_260;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  XrInstance_T local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_4c;
  undefined1 local_48 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  char *buffer_local;
  XrInstance pXStack_18;
  XrStructureType value_local;
  XrInstance instance_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  pXStack_18 = instance;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  local_4c = XR_OBJECT_TYPE_INSTANCE;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_48
             ,&stack0xffffffffffffffe8,&local_4c);
  VVar2 = VerifyXrInstanceHandle(&stack0xffffffffffffffe8);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pGVar3 = HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                       (&g_instance_info.
                         super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                        pXStack_18);
    local_290 = pGVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b0,"xrStructureTypeToString",&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d8,"xrStructureTypeToString",&local_2d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_300,"value",&local_301);
    bVar1 = ValidateXrEnum(pGVar3,(string *)local_2b0,(string *)local_2d8,(string *)local_300,
                           (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)local_48,value);
    std::__cxx11::string::~string(local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    std::__cxx11::string::~string(local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      sVar4 = strlen(buffer);
      pGVar3 = local_290;
      if (sVar4 < 0x41) {
        instance_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        gen_instance_info._4_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_548,"VUID-xrStructureTypeToString-buffer-parameter",&local_549);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_570,"xrStructureTypeToString",&local_571);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_590,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_5b0,"Command xrStructureTypeToString param buffer length is too long.",
                   &local_5b1);
        CoreValidLogMessage(pGVar3,(string *)local_548,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_570,&local_590,(string *)local_5b0);
        std::__cxx11::string::~string(local_5b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_590);
        std::__cxx11::string::~string(local_570);
        std::allocator<char>::~allocator((allocator<char> *)&local_571);
        std::__cxx11::string::~string(local_548);
        std::allocator<char>::~allocator((allocator<char> *)&local_549);
        instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        gen_instance_info._4_4_ = 1;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_480);
      std::operator<<((ostream *)local_480,"Invalid XrStructureType \"value\" enum value ");
      Uint32ToHexString_abi_cxx11_((uint32_t)local_4a0);
      std::operator<<((ostream *)local_480,local_4a0);
      std::__cxx11::string::~string(local_4a0);
      pGVar3 = local_290;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4c0,"VUID-xrStructureTypeToString-value-parameter",&local_4c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4e8,"xrStructureTypeToString",&local_4e9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_508,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_48);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(pGVar3,(string *)local_4c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_4e8,&local_508,local_528);
      std::__cxx11::string::~string((string *)local_528);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_508);
      std::__cxx11::string::~string(local_4e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
      std::__cxx11::string::~string(local_4c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
      instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      gen_instance_info._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream(local_480);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    std::operator<<((ostream *)local_1d8,"Invalid XrInstance handle \"instance\" ");
    HandleToHexString<XrInstance_T*>(local_1f8);
    std::operator<<((ostream *)local_1d8,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_218,"VUID-xrStructureTypeToString-instance-parameter",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"xrStructureTypeToString",&local_241);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_260,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_48);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_218,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_240,&local_260,local_280);
    std::__cxx11::string::~string((string *)local_280);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_260);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    instance_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    gen_instance_info._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  return instance_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrStructureTypeToString(
XrInstance instance,
XrStructureType value,
char buffer[XR_MAX_STRUCTURE_NAME_SIZE]) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrStructureTypeToString-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrStructureTypeToString",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        // Make sure the enum type XrStructureType value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrStructureTypeToString", "xrStructureTypeToString", "value", objects_info, value)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrStructureType \"value\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(value));
            CoreValidLogMessage(gen_instance_info, "VUID-xrStructureTypeToString-value-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrStructureTypeToString",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        if (XR_MAX_STRUCTURE_NAME_SIZE < std::strlen(buffer)) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrStructureTypeToString-buffer-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrStructureTypeToString",
                                objects_info,
                                "Command xrStructureTypeToString param buffer length is too long.");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}